

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void refresh(void)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  char (*pacVar5) [8];
  int iVar6;
  long lVar7;
  
  num_now[0] = 0;
  num_now[1] = 0;
  lVar3 = 0;
  pacVar5 = chessboard;
  iVar4 = 0;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      if (((*pacVar5)[lVar7] & 0xfeU) != 4) {
        (*pacVar5)[lVar7] = '\0';
        iVar1 = canrev((int)lVar3,(int)lVar7,chessboard,WHITE,0);
        if (0 < iVar1) {
          (*pacVar5)[lVar7] = (*pacVar5)[lVar7] + '\x01';
          iVar4 = iVar4 + 1;
          num_now[0] = iVar4;
        }
        iVar1 = canrev((int)lVar3,(int)lVar7,chessboard,BLACK,0);
        if (0 < iVar1) {
          (*pacVar5)[lVar7] = (*pacVar5)[lVar7] + '\x02';
          iVar6 = iVar6 + 1;
          num_now[1] = iVar6;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    lVar3 = lVar3 + 1;
    pacVar5 = pacVar5 + 1;
  } while (lVar3 != 8);
  uVar2 = 0x61;
  do {
    printf("   %c",(ulong)uVar2);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x69);
  pacVar5 = chessboard;
  lVar3 = 0;
  do {
    printf("\n ");
    iVar4 = 8;
    do {
      printf("+---");
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    printf("+\n%c",(ulong)((int)lVar3 + 0x31));
    lVar7 = 0;
    do {
      printf("| %c ",(ulong)(uint)(int)symbol[(*pacVar5)[lVar7]]);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    putchar(0x7c);
    lVar3 = lVar3 + 1;
    pacVar5 = pacVar5 + 1;
  } while (lVar3 != 8);
  printf("\n ");
  iVar4 = 8;
  do {
    printf("+---");
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  puts("+");
  return;
}

Assistant:

void refresh() {
    int i, j;
    num_now[0] = 0;
    num_now[1] = 0;
    for (i = 0; i < SIZE; i++) {
        for (j = 0; j < SIZE; j++) {
            if (chessboard[i][j] != WHITE && chessboard[i][j] != BLACK) {
                chessboard[i][j] = 0;
                if (canrev(i, j, chessboard, WHITE, 0) > 0) {
                    chessboard[i][j] += WHITE_;
                    num_now[0]++;
                }
                if (canrev(i, j, chessboard, BLACK, 0) > 0) {
                    chessboard[i][j] += BLACK_;
                    num_now[1]++;
                }
            }
        }
    }
    for (i = 0; i < SIZE; i++) {
        printf("   %c", 'a' + i);
    }
    for (i = 0; i < SIZE; i++) {
        printf("\n ");
        for (j = 0; j < SIZE; j++) {
            printf("+---");
        }
        printf("+\n%c", '1' + i);
        for (j = 0; j < SIZE; j++) {
            printf("| %c ", symbol[chessboard[i][j]]);
        }
        printf("|");
    }
    printf("\n ");
    for (i = 0; i < SIZE; i++) {
        printf("+---");
    }
    printf("+\n");
}